

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::DateTimePatternGenerator::getBestAppending
          (UnicodeString *__return_storage_ptr__,DateTimePatternGenerator *this,
          int32_t missingFields,int32_t flags,UErrorCode *status,
          UDateTimePatternMatchOptions options)

{
  bool bVar1;
  UDateTimePatternField UVar2;
  int iVar3;
  UnicodeString *pUVar4;
  DistanceInfo *missingFields_00;
  long lVar5;
  UDateTimePatternField field;
  uint uVar6;
  PtnSkeleton *specifiedSkeleton;
  UnicodeString resultPattern;
  UnicodeString *values [3];
  UnicodeString tempPattern;
  UnicodeString appendName;
  PtnSkeleton *local_160;
  UnicodeString local_158;
  UnicodeString *local_118;
  UnicodeString *local_110;
  UnicodeString *local_108;
  UnicodeString local_f8;
  undefined1 local_b8 [72];
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *status) {
    (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_00487e70;
    (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
    return __return_storage_ptr__;
  }
  local_158.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00487e70;
  local_158.fUnion.fStackFields.fLengthAndFlags = 2;
  local_f8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00487e70;
  local_f8.fUnion.fStackFields.fLengthAndFlags = 2;
  if (missingFields != 0) {
    local_b8._0_8_ = &PTR__UnicodeString_00487e70;
    local_b8._8_2_ = 2;
    icu_63::UnicodeString::moveFrom(&local_158,(UnicodeString *)local_b8);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b8);
    local_160 = (PtnSkeleton *)0x0;
    pUVar4 = getBestRaw(this,this->dtMatcher,missingFields,this->distanceInfo,status,&local_160);
    if (U_ZERO_ERROR < *status) {
LAB_002e864d:
      (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
           (_func_int **)&PTR__UnicodeString_00487e70;
      (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
      goto LAB_002e88c8;
    }
    icu_63::UnicodeString::operator=(&local_f8,pUVar4);
    adjustFieldTypes((UnicodeString *)local_b8,this,&local_f8,local_160,flags,options);
    icu_63::UnicodeString::moveFrom(&local_158,(UnicodeString *)local_b8);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b8);
    missingFields_00 = this->distanceInfo;
    uVar6 = missingFields_00->missingFieldMask;
    if (uVar6 != 0) {
      if (((~missingFields & 0x6000U) == 0) && ((uVar6 & 0x6000) == 0x4000)) {
        adjustFieldTypes((UnicodeString *)local_b8,this,&local_158,local_160,flags | 1,options);
        icu_63::UnicodeString::moveFrom(&local_158,(UnicodeString *)local_b8);
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b8);
        missingFields_00 = this->distanceInfo;
        uVar6 = missingFields_00->missingFieldMask & 0xffffbfff;
        missingFields_00->missingFieldMask = uVar6;
        if (uVar6 == 0) goto LAB_002e88bb;
      }
      pUVar4 = getBestRaw(this,this->dtMatcher,uVar6,missingFields_00,status,&local_160);
      if (U_ZERO_ERROR < *status) goto LAB_002e864d;
      icu_63::UnicodeString::operator=(&local_f8,pUVar4);
      adjustFieldTypes((UnicodeString *)local_b8,this,&local_f8,local_160,flags,options);
      icu_63::UnicodeString::moveFrom(&local_f8,(UnicodeString *)local_b8);
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b8);
      uVar6 = uVar6 & ~this->distanceInfo->missingFieldMask;
      if (uVar6 == 0) {
        field = UDATPG_ERA_FIELD;
      }
      else {
        UVar2 = ~UDATPG_ERA_FIELD;
        do {
          UVar2 = UVar2 + UDATPG_YEAR_FIELD;
          bVar1 = 1 < uVar6;
          uVar6 = (int)uVar6 >> 1;
        } while (bVar1);
        field = UDATPG_ZONE_FIELD;
        if (UVar2 < UDATPG_ZONE_FIELD) {
          field = UVar2;
        }
      }
      lVar5 = (ulong)field * 0x40;
      if (*(short *)(&this->field_0x110 + lVar5) < 0) {
        iVar3 = *(int *)(&this->field_0x114 + lVar5);
      }
      else {
        iVar3 = (int)*(short *)(&this->field_0x110 + lVar5) >> 5;
      }
      if (iVar3 != 0) {
        local_70.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_00487e70;
        local_70.fUnion.fStackFields.fLengthAndFlags = 2;
        getAppendName(this,field,&local_70);
        local_118 = &local_158;
        local_110 = &local_f8;
        local_108 = &local_70;
        SimpleFormatter::SimpleFormatter
                  ((SimpleFormatter *)local_b8,(UnicodeString *)(&this->field_0x108 + lVar5),2,3,
                   status);
        SimpleFormatter::formatAndReplace
                  ((SimpleFormatter *)local_b8,&local_118,3,&local_158,(int32_t *)0x0,0,status);
        SimpleFormatter::~SimpleFormatter((SimpleFormatter *)local_b8);
        icu_63::UnicodeString::~UnicodeString(&local_70);
      }
    }
  }
LAB_002e88bb:
  icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,&local_158);
LAB_002e88c8:
  icu_63::UnicodeString::~UnicodeString(&local_f8);
  icu_63::UnicodeString::~UnicodeString(&local_158);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
DateTimePatternGenerator::getBestAppending(int32_t missingFields, int32_t flags, UErrorCode &status, UDateTimePatternMatchOptions options) {
    if (U_FAILURE(status)) {
        return UnicodeString();
    }
    UnicodeString  resultPattern, tempPattern;
    const UnicodeString* tempPatternPtr;
    int32_t lastMissingFieldMask=0;
    if (missingFields!=0) {
        resultPattern=UnicodeString();
        const PtnSkeleton* specifiedSkeleton=nullptr;
        tempPatternPtr = getBestRaw(*dtMatcher, missingFields, distanceInfo, status, &specifiedSkeleton);
        if (U_FAILURE(status)) {
            return UnicodeString();
        }
        tempPattern = *tempPatternPtr;
        resultPattern = adjustFieldTypes(tempPattern, specifiedSkeleton, flags, options);
        if ( distanceInfo->missingFieldMask==0 ) {
            return resultPattern;
        }
        while (distanceInfo->missingFieldMask!=0) { // precondition: EVERY single field must work!
            if ( lastMissingFieldMask == distanceInfo->missingFieldMask ) {
                break;  // cannot find the proper missing field
            }
            if (((distanceInfo->missingFieldMask & UDATPG_SECOND_AND_FRACTIONAL_MASK)==UDATPG_FRACTIONAL_MASK) &&
                ((missingFields & UDATPG_SECOND_AND_FRACTIONAL_MASK) == UDATPG_SECOND_AND_FRACTIONAL_MASK)) {
                resultPattern = adjustFieldTypes(resultPattern, specifiedSkeleton, flags | kDTPGFixFractionalSeconds, options);
                distanceInfo->missingFieldMask &= ~UDATPG_FRACTIONAL_MASK;
                continue;
            }
            int32_t startingMask = distanceInfo->missingFieldMask;
            tempPatternPtr = getBestRaw(*dtMatcher, distanceInfo->missingFieldMask, distanceInfo, status, &specifiedSkeleton);
            if (U_FAILURE(status)) {
                return UnicodeString();
            }
            tempPattern = *tempPatternPtr;
            tempPattern = adjustFieldTypes(tempPattern, specifiedSkeleton, flags, options);
            int32_t foundMask=startingMask& ~distanceInfo->missingFieldMask;
            int32_t topField=getTopBitNumber(foundMask);

            if (appendItemFormats[topField].length() != 0) {
                UnicodeString appendName;
                getAppendName((UDateTimePatternField)topField, appendName);
                const UnicodeString *values[3] = {
                    &resultPattern,
                    &tempPattern,
                    &appendName
                };
                SimpleFormatter(appendItemFormats[topField], 2, 3, status).
                    formatAndReplace(values, 3, resultPattern, nullptr, 0, status);
            }
            lastMissingFieldMask = distanceInfo->missingFieldMask;
        }
    }
    return resultPattern;
}